

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xeTestCase.cpp
# Opt level: O0

void xe::removeEmptyGroups
               (set<const_xe::TestNode_*,_std::less<const_xe::TestNode_*>,_std::allocator<const_xe::TestNode_*>_>
                *nodeSet,TestGroup *group)

{
  TestGroup *nodeSet_00;
  bool bVar1;
  TestGroup *pTVar2;
  TestGroup *local_20;
  TestGroup *local_18;
  TestGroup *group_local;
  set<const_xe::TestNode_*,_std::less<const_xe::TestNode_*>,_std::allocator<const_xe::TestNode_*>_>
  *nodeSet_local;
  
  local_18 = group;
  group_local = (TestGroup *)nodeSet;
  bVar1 = hasChildrenInSet(nodeSet,group);
  if (!bVar1) {
    local_20 = local_18;
    std::
    set<const_xe::TestNode_*,_std::less<const_xe::TestNode_*>,_std::allocator<const_xe::TestNode_*>_>
    ::erase((set<const_xe::TestNode_*,_std::less<const_xe::TestNode_*>,_std::allocator<const_xe::TestNode_*>_>
             *)group_local,(key_type *)&local_20);
    pTVar2 = TestNode::getParent(&local_18->super_TestNode);
    nodeSet_00 = group_local;
    if (pTVar2 != (TestGroup *)0x0) {
      pTVar2 = TestNode::getParent(&local_18->super_TestNode);
      removeEmptyGroups((set<const_xe::TestNode_*,_std::less<const_xe::TestNode_*>,_std::allocator<const_xe::TestNode_*>_>
                         *)nodeSet_00,pTVar2);
    }
  }
  return;
}

Assistant:

static void removeEmptyGroups (std::set<const TestNode*>& nodeSet, const TestGroup* group)
{
	if (!hasChildrenInSet(nodeSet, group))
	{
		nodeSet.erase(group);
		if (group->getParent() != DE_NULL)
			removeEmptyGroups(nodeSet, group->getParent());
	}
}